

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirmataMarshaller.cpp
# Opt level: O1

void __thiscall
firmata::FirmataMarshaller::sendFirmwareVersion
          (FirmataMarshaller *this,uint8_t major,uint8_t minor,size_t bytec,uint8_t *bytev)

{
  Stream *pSVar1;
  int iVar2;
  int *piVar3;
  
  pSVar1 = this->FirmataStream;
  if (pSVar1 != (Stream *)0x0) {
    iVar2 = (*pSVar1->_vptr_Stream[6])(pSVar1,0xf0);
    if (iVar2 != 0) {
      piVar3 = __errno_location();
      *piVar3 = iVar2;
    }
    iVar2 = (*this->FirmataStream->_vptr_Stream[6])(this->FirmataStream,0x79);
    if (iVar2 != 0) {
      piVar3 = __errno_location();
      *piVar3 = iVar2;
    }
    iVar2 = (*this->FirmataStream->_vptr_Stream[6])(this->FirmataStream,(ulong)major);
    if (iVar2 != 0) {
      piVar3 = __errno_location();
      *piVar3 = iVar2;
    }
    iVar2 = (*this->FirmataStream->_vptr_Stream[6])(this->FirmataStream,minor);
    if (iVar2 != 0) {
      piVar3 = __errno_location();
      *piVar3 = iVar2;
    }
    if (bytec != 0) {
      do {
        encodeByteStream(this,1,bytev,0);
        bytev = bytev + 1;
        bytec = bytec - 1;
      } while (bytec != 0);
    }
    iVar2 = (*this->FirmataStream->_vptr_Stream[6])(this->FirmataStream,0xf7);
    if (iVar2 != 0) {
      piVar3 = __errno_location();
      *piVar3 = iVar2;
    }
  }
  return;
}

Assistant:

void FirmataMarshaller::sendFirmwareVersion(uint8_t major, uint8_t minor, size_t bytec, uint8_t *bytev)
const
{
  if ( (Stream *)NULL == FirmataStream ) { return; }
  size_t i;
  FirmataStream->write(START_SYSEX);
  FirmataStream->write(REPORT_FIRMWARE);
  FirmataStream->write(major);
  FirmataStream->write(minor);
  for (i = 0; i < bytec; ++i) {
    encodeByteStream(sizeof(bytev[i]), reinterpret_cast<uint8_t *>(&bytev[i]));
  }
  FirmataStream->write(END_SYSEX);
}